

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipstream.cpp
# Opt level: O3

void __thiscall ZipStream::ZipStream(ZipStream *this,string *zipName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  ushort uVar4;
  int iVar5;
  uint8_t *data;
  FILE *pFVar6;
  char *__s;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_type sVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  char acStack_20098 [8];
  char fileName [65536];
  ushort uStack_10090;
  ushort uStack_1008e;
  undefined1 uStack_1008c;
  byte bStack_1008b;
  undefined2 uStack_1008a;
  uint t;
  ulong uStack_1007c;
  size_type sStack_10070;
  ulong uStack_10060;
  undefined1 local_86 [8];
  CentralDirEntry cd;
  ulong local_50;
  int64_t offset;
  uint local_3c;
  ulong uStack_38;
  uint32_t flags;
  
  paVar1 = &(this->zipName_).field_2;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries_).super__Vector_base<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zipName_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (zipName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->zipName_,pcVar2,pcVar2 + zipName->_M_string_length);
  (this->f_)._vptr_File = (_func_int **)&PTR__File_0014b900;
  (this->f_).fp_ = (FILE *)0x0;
  pFVar6 = fopen((zipName->_M_dataplus)._M_p,"rb");
  (this->f_).fp_ = (FILE *)pFVar6;
  fseek(pFVar6,-0x11,2);
  iVar15 = 0x10008;
  do {
    fseek((FILE *)(this->f_).fp_,-5,1);
    fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
    iVar5 = iVar15 + -1;
    if (CONCAT22(uStack_1008e,uStack_10090) == 0x6054b50) break;
    bVar16 = iVar15 != 1;
    iVar15 = iVar5;
  } while (bVar16);
  pFVar6 = (FILE *)(this->f_).fp_;
  if (iVar5 == 0) {
    if (pFVar6 != (FILE *)0x0) {
      fclose(pFVar6);
    }
    (this->f_).fp_ = (FILE *)0x0;
  }
  else {
    offset = (int64_t)paVar1;
    cd._38_8_ = ftell(pFVar6);
    fseek((FILE *)(this->f_).fp_,4,1);
    fread(&uStack_10090,1,2,(FILE *)(this->f_).fp_);
    uVar8 = (ulong)uStack_10090;
    fseek((FILE *)(this->f_).fp_,2,1);
    fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
    fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
    uVar14 = CONCAT22(uStack_1008e,uStack_10090);
    fread(&uStack_10090,1,2,(FILE *)(this->f_).fp_);
    uVar9 = (ulong)uStack_10090;
    if (uVar9 != 0) {
      uStack_38 = uVar8;
      __s = (char *)operator_new__(uVar9 + 1);
      memset(__s,0,uVar9 + 1);
      pcVar3 = (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = __s;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
        __s = (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl;
      }
      fread(__s,1,uVar9,(FILE *)(this->f_).fp_);
      (this->comment_)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar9] = '\0';
      uVar8 = uStack_38;
    }
    uVar9 = (ulong)uVar14;
    if ((int)uVar8 == 0xffff || uVar14 == 0xffffffff) {
      fseek((FILE *)(this->f_).fp_,cd._38_8_ + -0x18,0);
      fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
      if (CONCAT22(uStack_1008e,uStack_10090) != 0x7064b50) {
        return;
      }
      fseek((FILE *)(this->f_).fp_,4,1);
      fread(&uStack_10090,1,8,(FILE *)(this->f_).fp_);
      fseek((FILE *)(this->f_).fp_,
            CONCAT26(uStack_1008a,
                     CONCAT15(bStack_1008b,
                              CONCAT14(uStack_1008c,CONCAT22(uStack_1008e,uStack_10090)))),0);
      fread(&uStack_10090,1,0x38,(FILE *)(this->f_).fp_);
      uVar8 = sStack_10070;
      uVar9 = uStack_10060;
    }
    std::vector<ZipStream::Entry,_std::allocator<ZipStream::Entry>_>::reserve(&this->entries_,uVar8)
    ;
    fseek((FILE *)(this->f_).fp_,uVar9,0);
    if (0 < (long)uVar8) {
      sVar13 = 0;
      uStack_38 = uVar8;
      do {
        fread(local_86,1,0x2e,(FILE *)(this->f_).fp_);
        uVar8 = (ulong)(ushort)cd.compSize;
        sVar7 = fread(acStack_20098,1,uVar8,(FILE *)(this->f_).fp_);
        acStack_20098[sVar7] = '\0';
        fseek((FILE *)(this->f_).fp_,uVar8 - sVar7,1);
        uVar4 = cd.compSize._2_2_;
        local_50 = (ulong)(uint)cd._34_4_;
        uVar14 = (uint)cd.compSize._2_2_;
        memset(&uStack_10090,0,0x10003);
        if (uVar4 != 0) {
          do {
            fread(&uStack_10090,1,4,(FILE *)(this->f_).fp_);
            fread(&uStack_1008c,1,(ulong)uStack_1008e,(FILE *)(this->f_).fp_);
            if (uStack_10090 == 0x7875) {
              uVar8 = (ulong)bStack_1008b;
              uVar9 = 0;
              uVar10 = 0;
              if (uVar8 != 0) {
                uVar10 = 0;
                uVar12 = uVar8;
                do {
                  uVar11 = uVar12 - 1;
                  uVar10 = (ulong)((int)uVar10 << 8 | (uint)(&bStack_1008b)[uVar12]);
                  uVar12 = uVar11;
                } while ((char)uVar11 != '\0');
              }
              uVar12 = (ulong)*(byte *)((long)&uStack_1008a + uVar8);
              if (uVar12 != 0) {
                uVar9 = 0;
                do {
                  uVar12 = uVar12 - 1;
                  uVar9 = (ulong)((int)uVar9 << 8 |
                                 (uint)*(byte *)((long)&uStack_1008a + uVar12 + uVar8 + 1));
                } while ((char)uVar12 != '\0');
              }
              printf("UID %x GID %x\n",uVar10,uVar9);
            }
            else if (uStack_10090 != 0x5455) {
              if (uStack_10090 == 1) {
                local_50 = uStack_1007c;
              }
              else {
                printf("**Warning: Ignoring extra block %04x\n");
              }
            }
            uVar14 = (uVar14 - uStack_1008e) - 4;
          } while (0 < (int)uVar14);
        }
        fseek((FILE *)(this->f_).fp_,(ulong)(ushort)cd.uncompSize,1);
        local_3c = 0;
        std::vector<ZipStream::Entry,std::allocator<ZipStream::Entry>>::
        emplace_back<char(&)[65536],long&,unsigned_int_const&>
                  ((vector<ZipStream::Entry,std::allocator<ZipStream::Entry>> *)this,
                   (char (*) [65536])acStack_20098,(long *)&local_50,&local_3c);
        sVar13 = sVar13 + 1;
      } while (sVar13 != uStack_38);
    }
  }
  return;
}

Assistant:

ZipStream::ZipStream(const std::string& zipName)
    : zipName_(zipName), f_{zipName}
{
    uint32_t id = 0;
    // Find CD by scanning backwards from end
    f_.seek(-22 + 5, SEEK_END);
    int counter = 64 * 1024 + 8;
    while (id != EndOfCD_SIG && counter > 0) {
        f_.seek(-5, SEEK_CUR);
        id = f_.Read<uint32_t>();
        counter--;
    }
    if (counter <= 0) {
        f_.close();
        return;
    }

    auto start = f_.tell();
    f_.seek(4, SEEK_CUR);
    int64_t entryCount = f_.Read<uint16_t>();
    f_.seek(2, SEEK_CUR);
    /* auto cdSize = */ f_.Read<uint32_t>();
    int64_t cdOffset = f_.Read<uint32_t>();
    auto commentLen = f_.Read<uint16_t>();
    if (commentLen > 0) {
        comment_ = std::make_unique<char[]>(commentLen + 1);
        f_.Read(comment_.get(), commentLen);
        comment_[commentLen] = 0;
    }

    if (entryCount == 0xffff || cdOffset == 0xffffffff) {
        // Find zip64 data
        f_.seek(start - 6 * 4, SEEK_SET);
        id = f_.Read<uint32_t>();
        if (id != EndOfCD64Locator_SIG) {
            return;
        }
        f_.seek(4, SEEK_CUR);
        auto cdStart = f_.Read<int64_t>();
        f_.seek(cdStart, SEEK_SET);
        auto eocd64 = f_.Read<EndOfCentralDir64>();

        cdOffset = eocd64.cdoffset;
        entryCount = eocd64.entries;
    }

    entries_.reserve(entryCount);

    f_.seek(cdOffset, SEEK_SET);
    char fileName[65536];
    for (auto i = 0L; i < entryCount; i++) {
        auto const cd = f_.Read<CentralDirEntry>();
        auto const rc = f_.Read(&fileName, cd.nameLen);
        fileName[rc] = 0;
        f_.seek(cd.nameLen - rc, SEEK_CUR);
        int64_t offset = cd.offset;
        int exLen = cd.exLen;
        Extra extra{};
        while (exLen > 0) {
            f_.Read((uint8_t*)&extra, 4);
            f_.Read(extra.data, extra.size);
            if (extra.id == 0x01) {
                offset = extra.zip64.offset;
            } else if (extra.id == 0x7875) {
                auto const* ptr = &extra.data[1];
                uint32_t const uid = decodeInt(&ptr);
                uint32_t const gid = decodeInt(&ptr);
                printf("UID %x GID %x\n", uid, gid);
            } else if (extra.id == 0x5455) {
                // TODO: Read timestamps
            } else
                printf("**Warning: Ignoring extra block %04x\n", extra.id);

            exLen -= (extra.size + 4);
        }

        f_.seek(cd.commLen, SEEK_CUR);
        auto const flags = ((cd.attr1 & (S_IFREG >> 16)) == 0)
                               ? // Some archives have broken attributes
                               0
                               : cd.attr1 >> 16;
        entries_.emplace_back(fileName, offset, flags);
    }
}